

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_column_reader.cpp
# Opt level: O3

void duckdb::StringColumnReader::VerifyString(char *str_data,uint32_t str_len,bool is_varchar)

{
  UnicodeType UVar1;
  InvalidInputException *this;
  long *plVar2;
  size_t *invalid_pos;
  size_type *psVar3;
  undefined7 in_register_00000011;
  string_t blob;
  UnicodeInvalidReason reason;
  size_t pos;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  UnicodeInvalidReason local_94;
  string local_90;
  string local_70;
  size_t local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((int)CONCAT71(in_register_00000011,is_varchar) != 0) {
    invalid_pos = &local_50;
    UVar1 = Utf8Proc::Analyze(str_data,(ulong)str_len,&local_94,invalid_pos);
    if (UVar1 == INVALID) {
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      if (str_len < 0xd) {
        uStack_9c = 0;
        uStack_a4 = 0;
        uStack_a0 = 0;
        if (str_len == 0) {
          str_data = (char *)0x0;
        }
        else {
          switchD_012bc561::default(&uStack_a4,str_data,(ulong)str_len);
          str_data = (char *)CONCAT44(uStack_9c,uStack_a0);
        }
      }
      else {
        uStack_a4 = *(undefined4 *)str_data;
      }
      blob.value.pointer.ptr = (char *)invalid_pos;
      blob.value._0_8_ = str_data;
      Blob::ToString_abi_cxx11_(&local_70,(Blob *)CONCAT44(uStack_a4,str_len),blob);
      ::std::operator+(&local_48,"Invalid string encoding found in Parquet file: value \"",&local_70
                      );
      plVar2 = (long *)::std::__cxx11::string::append((char *)&local_48);
      local_90._M_dataplus._M_p = (pointer)*plVar2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((size_type *)local_90._M_dataplus._M_p == psVar3) {
        local_90.field_2._M_allocated_capacity = *psVar3;
        local_90.field_2._8_8_ = plVar2[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar3;
      }
      local_90._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      InvalidInputException::InvalidInputException(this,&local_90);
      __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void StringColumnReader::VerifyString(const char *str_data, uint32_t str_len, const bool is_varchar) {
	if (!is_varchar) {
		return;
	}
	// verify if a string is actually UTF8, and if there are no null bytes in the middle of the string
	// technically Parquet should guarantee this, but reality is often disappointing
	UnicodeInvalidReason reason;
	size_t pos;
	auto utf_type = Utf8Proc::Analyze(str_data, str_len, &reason, &pos);
	if (utf_type == UnicodeType::INVALID) {
		throw InvalidInputException("Invalid string encoding found in Parquet file: value \"" +
		                            Blob::ToString(string_t(str_data, str_len)) + "\" is not valid UTF8!");
	}
}